

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)4>::fetch_sprite
          (SMSFetcher<(TI::TMS::Personality)4> *this,int sprite)

{
  iterator pvVar1;
  Base<(TI::TMS::Personality)4> *pBVar2;
  unsigned_short uVar3;
  uint uVar4;
  byte *pbVar5;
  reference pvVar6;
  ushort uVar7;
  int iVar8;
  byte bVar9;
  AddressT graphic_location;
  uint8_t name;
  value_type *sprite_buffer;
  int sprite_local;
  SMSFetcher<(TI::TMS::Personality)4> *this_local;
  
  pvVar1 = this->base->fetch_sprite_buffer_;
  pBVar2 = this->base;
  uVar7 = this->storage->sprite_attribute_table_address_;
  uVar4 = bits<7,int>(pvVar1->active_sprites[sprite].index << 1);
  pbVar5 = std::array<unsigned_char,_16384UL>::operator[](&pBVar2->ram_,(long)(int)(uVar7 & uVar4));
  iVar8 = 0;
  if ((this->storage->shift_sprites_8px_left_ & 1U) != 0) {
    iVar8 = 8;
  }
  pvVar1->active_sprites[sprite].x = (uint)*pbVar5 - iVar8;
  pBVar2 = this->base;
  uVar7 = this->storage->sprite_attribute_table_address_;
  uVar4 = bits<7,int>(pvVar1->active_sprites[sprite].index << 1 | 1);
  pbVar5 = std::array<unsigned_char,_16384UL>::operator[](&pBVar2->ram_,(long)(int)(uVar7 & uVar4));
  bVar9 = 0xff;
  if ((this->base->sprites_16x16_ & 1U) != 0) {
    bVar9 = 0xfe;
  }
  uVar7 = this->storage->sprite_generator_table_address_;
  uVar3 = bits<13,unsigned_short>
                    ((ushort)(*pbVar5 & bVar9) << 5 |
                     (ushort)(pvVar1->active_sprites[sprite].row << 2));
  uVar7 = uVar7 & uVar3;
  pvVar6 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,(ulong)uVar7);
  pvVar1->active_sprites[sprite].image[0] = *pvVar6;
  pvVar6 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,(long)(int)(uVar7 + 1));
  pvVar1->active_sprites[sprite].image[1] = *pvVar6;
  pvVar6 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,(long)(int)(uVar7 + 2));
  pvVar1->active_sprites[sprite].image[2] = *pvVar6;
  pvVar6 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,(long)(int)(uVar7 + 3));
  pvVar1->active_sprites[sprite].image[3] = *pvVar6;
  return;
}

Assistant:

void fetch_sprite(int sprite) {
		auto &sprite_buffer = *base->fetch_sprite_buffer_;
		sprite_buffer.active_sprites[sprite].x =
			base->ram_[
				storage->sprite_attribute_table_address_ & bits<7>((sprite_buffer.active_sprites[sprite].index << 1) | 0)
			] - (storage->shift_sprites_8px_left_ ? 8 : 0);
		const uint8_t name = base->ram_[
				storage->sprite_attribute_table_address_ & bits<7>((sprite_buffer.active_sprites[sprite].index << 1) | 1)
			] & (base->sprites_16x16_ ? ~1 : ~0);

		const AddressT graphic_location =
			storage->sprite_generator_table_address_ &
			bits<13>(AddressT((name << 5) | (sprite_buffer.active_sprites[sprite].row << 2)));
		sprite_buffer.active_sprites[sprite].image[0] = base->ram_[graphic_location];
		sprite_buffer.active_sprites[sprite].image[1] = base->ram_[graphic_location+1];
		sprite_buffer.active_sprites[sprite].image[2] = base->ram_[graphic_location+2];
		sprite_buffer.active_sprites[sprite].image[3] = base->ram_[graphic_location+3];
	}